

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::genRandomTest
               (Random *rng,BlendState *preCommon,BlendState *postCommon,
               vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
               *drawBuffers,int maxDrawBufferCount,Context *context)

{
  bool bVar1;
  bool *pbVar2;
  float fVar3;
  DrawBufferInfo local_188;
  bool local_101;
  Maybe<bool> local_100;
  bool local_e9;
  Maybe<bool> local_e8;
  Maybe<bool> local_d8 [2];
  undefined1 local_b8 [8];
  BlendState blendState;
  TextureFormat format;
  IVec2 size;
  bool render;
  int drawBufferNdx;
  Context *context_local;
  int maxDrawBufferCount_local;
  vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
  *drawBuffers_local;
  BlendState *postCommon_local;
  BlendState *preCommon_local;
  Random *rng_local;
  
  genRandomBlendState(rng,preCommon);
  genRandomBlendState(rng,postCommon);
  for (size.m_data[1] = 0; size.m_data[1] < maxDrawBufferCount; size.m_data[1] = size.m_data[1] + 1)
  {
    fVar3 = de::Random::getFloat(rng);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&format,0x40,0x40);
    blendState.colorMask.field_1 =
         (anon_union_8_2_d0736028_for_Maybe<tcu::Vector<bool,_4>_>_2)getRandomFormat(rng,context);
    BlendState::BlendState((BlendState *)local_b8);
    genRandomBlendState(rng,(BlendState *)local_b8);
    if (blendState.colorMask.field_1.m_align._4_4_ == 0x23) {
      bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)postCommon);
      if ((bVar1) &&
         (pbVar2 = tcu::Maybe<bool>::operator*(&postCommon->enableBlend), (*pbVar2 & 1U) != 0)) {
        bVar1 = de::Random::getBool(rng);
        if (bVar1) {
          tcu::nothing<bool>();
          tcu::Maybe<bool>::operator=(&postCommon->enableBlend,local_d8);
          tcu::Maybe<bool>::~Maybe(local_d8);
        }
        else {
          local_e9 = false;
          tcu::just<bool>((tcu *)&local_e8,&local_e9);
          tcu::Maybe<bool>::operator=(&postCommon->enableBlend,&local_e8);
          tcu::Maybe<bool>::~Maybe(&local_e8);
        }
      }
      bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)postCommon);
      if ((!bVar1) &&
         (((bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)preCommon), bVar1 &&
           (pbVar2 = tcu::Maybe<bool>::operator*(&preCommon->enableBlend), (*pbVar2 & 1U) != 0)) ||
          (bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)local_b8), bVar1)))) {
        local_101 = false;
        tcu::just<bool>((tcu *)&local_100,&local_101);
        tcu::Maybe<bool>::operator=((Maybe<bool> *)local_b8,&local_100);
        tcu::Maybe<bool>::~Maybe(&local_100);
      }
    }
    DrawBufferInfo::DrawBufferInfo
              (&local_188,0.1 < fVar3,(IVec2 *)&format,(BlendState *)local_b8,
               (TextureFormat *)&blendState.colorMask.field_1);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DrawBufferInfo>_>
    ::push_back(drawBuffers,&local_188);
    DrawBufferInfo::~DrawBufferInfo(&local_188);
    BlendState::~BlendState((BlendState *)local_b8);
  }
  return;
}

Assistant:

void genRandomTest (de::Random& rng, BlendState& preCommon, BlendState& postCommon, vector<DrawBufferInfo>& drawBuffers, int maxDrawBufferCount, Context& context)
{
	genRandomBlendState(rng, preCommon);
	genRandomBlendState(rng, postCommon);

	for (int drawBufferNdx = 0; drawBufferNdx < maxDrawBufferCount; drawBufferNdx++)
	{
		const bool			render		= rng.getFloat() > 0.1f;
		const IVec2			size		(64, 64);
		const TextureFormat	format		(getRandomFormat(rng, context));
		BlendState			blendState;

		genRandomBlendState(rng, blendState);

		// 32bit float formats don't support blending in GLES32
		if (format.type == tcu::TextureFormat::FLOAT)
		{
			// If format is 32bit float post common can't enable blending
			if (postCommon.enableBlend && *postCommon.enableBlend)
			{
				// Either don't set enable blend or disable blending
				if (rng.getBool())
					postCommon.enableBlend = tcu::nothing<bool>();
				else
					postCommon.enableBlend = tcu::just(false);
			}

			// If post common doesn't disable blending, per attachment state or
			// pre common must.
			if (!postCommon.enableBlend)
			{
				// If pre common enables blend per attachment must disable it
				// If per attachment state changes blend state it must disable it
				if ((preCommon.enableBlend && *preCommon.enableBlend)
					|| blendState.enableBlend)
					blendState.enableBlend = tcu::just(false);
			}
		}

		drawBuffers.push_back(DrawBufferInfo(render, size, blendState, format));
	}
}